

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long vorbis_book_decodevv_add(codebook *book,float **a,long offset,int ch,oggpack_buffer *b,int n)

{
  float *pfVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  float *t;
  int m;
  int chptr;
  long entry;
  long j;
  long i;
  int n_local;
  oggpack_buffer *b_local;
  int ch_local;
  long offset_local;
  float **a_local;
  codebook *book_local;
  
  t._4_4_ = 0;
  if (0 < book->used_entries) {
    iVar4 = (int)((offset + n) / (long)ch);
    j = offset / (long)ch;
    while (j < iVar4) {
      lVar5 = decode_packed_entry_number(book,b);
      if (lVar5 == -1) {
        return -1;
      }
      pfVar1 = book->valuelist;
      lVar2 = book->dim;
      entry = 0;
      while( true ) {
        bVar3 = false;
        if (j < iVar4) {
          bVar3 = entry < book->dim;
        }
        if (!bVar3) break;
        iVar6 = t._4_4_ + 1;
        a[t._4_4_][j] = pfVar1[lVar5 * lVar2 + entry] + a[t._4_4_][j];
        t._4_4_ = iVar6;
        if (iVar6 == ch) {
          t._4_4_ = 0;
          j = j + 1;
        }
        entry = entry + 1;
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevv_add(codebook *book,float **a,long offset,int ch,
                              oggpack_buffer *b,int n){

  long i,j,entry;
  int chptr=0;
  if(book->used_entries>0){
    int m=(offset+n)/ch;
    for(i=offset/ch;i<m;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      {
        const float *t = book->valuelist+entry*book->dim;
        for (j=0;i<m && j<book->dim;j++){
          a[chptr++][i]+=t[j];
          if(chptr==ch){
            chptr=0;
            i++;
          }
        }
      }
    }
  }
  return(0);
}